

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::LowerBailOnInvalidatedArrayHeadSegment(Lowerer *this,Instr *instr,bool isInHelperBlock)

{
  Func *func_00;
  code *pcVar1;
  undefined8 dst;
  undefined8 baseOpnd_00;
  bool bVar2;
  uint32 offset;
  undefined4 *puVar3;
  Opnd *pOVar4;
  IndirOpnd *pIVar5;
  StackSym *pSVar6;
  Instr *pIVar7;
  LabelInstr *target;
  Instr *this_00;
  ArrayRegOpnd *local_e8;
  undefined1 local_d8 [8];
  AutoReuseOpnd autoReuseInvalidatedHeadSegmentOpnd;
  RegOpnd *invalidatedHeadSegmentOpnd;
  Instr *callInstr;
  Instr *insertBeforeInstr;
  LabelInstr *skipBailOutLabel;
  Instr *callInstr_2;
  AutoReuseOpnd autoReuseHeadSegmentLengthBeforeHelperCallOpnd;
  RegOpnd *headSegmentLengthBeforeHelperCallOpnd;
  Instr *callInstr_1;
  undefined1 local_60 [8];
  AutoReuseOpnd autoReuseHeadSegmentBeforeHelperCallOpnd;
  RegOpnd *headSegmentBeforeHelperCallOpnd;
  ArrayRegOpnd *arrayOpnd;
  bool isArrayOrObjectWithArray;
  RegOpnd *pRStack_30;
  ValueType baseValueType;
  RegOpnd *baseOpnd;
  Func *func;
  bool isInHelperBlock_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3415,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((((instr->m_opcode != StElemI_A) && (instr->m_opcode != StElemI_A_Strict)) &&
      (instr->m_opcode != Memset)) && (instr->m_opcode != Memcopy)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3416,
                       "(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy)"
                       ,
                       "instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = IR::Instr::GetDst(instr);
  if (pOVar4 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3417,"(instr->GetDst())","instr->GetDst()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = IR::Instr::GetDst(instr);
  bVar2 = IR::Opnd::IsIndirOpnd(pOVar4);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3418,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  func_00 = instr->m_func;
  pOVar4 = IR::Instr::GetDst(instr);
  pIVar5 = IR::Opnd::AsIndirOpnd(pOVar4);
  pRStack_30 = IR::IndirOpnd::GetBaseOpnd(pIVar5);
  arrayOpnd._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&pRStack_30->super_Opnd);
  bVar2 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)((long)&arrayOpnd + 6));
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x341e,"(!baseValueType.IsNotArrayOrObjectWithArray())",
                       "!baseValueType.IsNotArrayOrObjectWithArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  arrayOpnd._5_1_ = ValueType::IsArrayOrObjectWithArray((ValueType *)((long)&arrayOpnd + 6));
  bVar2 = IR::RegOpnd::IsArrayRegOpnd(pRStack_30);
  if (bVar2) {
    local_e8 = IR::RegOpnd::AsArrayRegOpnd(pRStack_30);
  }
  else {
    local_e8 = (ArrayRegOpnd *)0x0;
  }
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_60);
  if ((((arrayOpnd._5_1_ & 1) == 0) || (local_e8 == (ArrayRegOpnd *)0x0)) ||
     (pSVar6 = IR::ArrayRegOpnd::HeadSegmentSym(local_e8), pSVar6 == (StackSym *)0x0)) {
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&pRStack_30->super_Opnd);
    pIVar7 = IR::Instr::New(Call,func_00);
    pSVar6 = StackSym::New(TyUint64,func_00);
    autoReuseHeadSegmentBeforeHelperCallOpnd._16_8_ = IR::RegOpnd::New(pSVar6,TyUint64,func_00);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)local_60,(Opnd *)autoReuseHeadSegmentBeforeHelperCallOpnd._16_8_,
               func_00,true);
    IR::Instr::SetDst(pIVar7,(Opnd *)autoReuseHeadSegmentBeforeHelperCallOpnd._16_8_);
    IR::Instr::InsertBefore(instr,pIVar7);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,pIVar7,
               HelperArray_Jit_GetArrayHeadSegmentForArrayOrObjectWithArray,(LabelInstr *)0x0,
               (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  }
  else {
    pSVar6 = IR::ArrayRegOpnd::HeadSegmentSym(local_e8);
    autoReuseHeadSegmentBeforeHelperCallOpnd._16_8_ = IR::RegOpnd::New(pSVar6,TyUint64,func_00);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)local_60,(Opnd *)autoReuseHeadSegmentBeforeHelperCallOpnd._16_8_,
               func_00,true);
  }
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)&callInstr_2);
  if ((((arrayOpnd._5_1_ & 1) == 0) || (local_e8 == (ArrayRegOpnd *)0x0)) ||
     (pSVar6 = IR::ArrayRegOpnd::HeadSegmentLengthSym(local_e8), pSVar6 == (StackSym *)0x0)) {
    pSVar6 = StackSym::New(TyUint32,func_00);
    autoReuseHeadSegmentLengthBeforeHelperCallOpnd._16_8_ =
         IR::RegOpnd::New(pSVar6,TyUint32,func_00);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&callInstr_2,
               (Opnd *)autoReuseHeadSegmentLengthBeforeHelperCallOpnd._16_8_,func_00,true);
    if ((((arrayOpnd._5_1_ & 1) == 0) || (local_e8 == (ArrayRegOpnd *)0x0)) ||
       (pSVar6 = IR::ArrayRegOpnd::HeadSegmentSym(local_e8),
       baseOpnd_00 = autoReuseHeadSegmentBeforeHelperCallOpnd._16_8_,
       dst = autoReuseHeadSegmentLengthBeforeHelperCallOpnd._16_8_, pSVar6 == (StackSym *)0x0)) {
      LowererMD::LoadHelperArgument
                (&this->m_lowererMD,instr,(Opnd *)autoReuseHeadSegmentBeforeHelperCallOpnd._16_8_);
      pIVar7 = IR::Instr::New(Call,func_00);
      IR::Instr::SetDst(pIVar7,(Opnd *)autoReuseHeadSegmentLengthBeforeHelperCallOpnd._16_8_);
      IR::Instr::InsertBefore(instr,pIVar7);
      LowererMD::ChangeToHelperCall
                (&this->m_lowererMD,pIVar7,HelperArray_Jit_GetArrayHeadSegmentLength,
                 (LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
    }
    else {
      offset = Js::SparseArraySegmentBase::GetOffsetOfLength();
      pIVar5 = IR::IndirOpnd::New((RegOpnd *)baseOpnd_00,offset,TyUint32,func_00,false);
      InsertMove((Opnd *)dst,&pIVar5->super_Opnd,instr,true);
    }
  }
  else {
    pSVar6 = IR::ArrayRegOpnd::HeadSegmentLengthSym(local_e8);
    autoReuseHeadSegmentLengthBeforeHelperCallOpnd._16_8_ =
         IR::RegOpnd::New(pSVar6,TyUint32,func_00);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&callInstr_2,
               (Opnd *)autoReuseHeadSegmentLengthBeforeHelperCallOpnd._16_8_,func_00,true);
  }
  target = IR::Instr::GetOrCreateContinueLabel(instr,isInHelperBlock);
  LowerOneBailOutKind(this,instr,BailOutOnInvalidatedArrayHeadSegment,isInHelperBlock,false);
  pIVar7 = instr->m_next;
  LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar7,&pRStack_30->super_Opnd);
  LowererMD::LoadHelperArgument
            (&this->m_lowererMD,pIVar7,(Opnd *)autoReuseHeadSegmentLengthBeforeHelperCallOpnd._16_8_
            );
  LowererMD::LoadHelperArgument
            (&this->m_lowererMD,pIVar7,(Opnd *)autoReuseHeadSegmentBeforeHelperCallOpnd._16_8_);
  this_00 = IR::Instr::New(Call,func_00);
  autoReuseInvalidatedHeadSegmentOpnd._16_8_ = IR::RegOpnd::New(TyUint8,func_00);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)local_d8,(Opnd *)autoReuseInvalidatedHeadSegmentOpnd._16_8_,func_00,
             true);
  IR::Instr::SetDst(this_00,(Opnd *)autoReuseInvalidatedHeadSegmentOpnd._16_8_);
  IR::Instr::InsertBefore(pIVar7,this_00);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,this_00,HelperArray_Jit_OperationInvalidatedArrayHeadSegment,
             (LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  InsertTestBranch((Opnd *)autoReuseInvalidatedHeadSegmentOpnd._16_8_,
                   (Opnd *)autoReuseInvalidatedHeadSegmentOpnd._16_8_,BrEq_A,target,pIVar7);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_d8);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&callInstr_2);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_60);
  return;
}

Assistant:

void Lowerer::LowerBailOnInvalidatedArrayHeadSegment(IR::Instr *const instr, const bool isInHelperBlock)
{
    /*
        // Generate checks for whether the head segment or the head segment length changed during the helper call

        if(!(baseValueType.IsArrayOrObjectWithArray() && arrayOpnd && arrayOpnd.HeadSegmentSym()))
        {
            // Record the array head segment before the helper call
            headSegmentBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayHeadSegmentForArrayOrObjectWithArray(base)
        }
        if(!(baseValueType.IsArrayOrObjectWithArray() && arrayOpnd && arrayOpnd.HeadSegmentLengthSym()))
        {
            // Record the array head segment length before the helper call
            if(baseValueType.IsArrayOrObjectWithArray() && arrayOpnd && arrayOpnd.HeadSegmentSym())
            {
                mov headSegmentLengthBeforeHelperCall, [headSegmentBeforeHelperCall + offsetOf(length)]
            }
            else
            {
                headSegmentLengthBeforeHelperCall =
                    Js::JavascriptArray::Jit_GetArrayHeadSegmentLength(headSegmentBeforeHelperCall)
            }
        }

        helperCall:
            (Helper call and other bailout checks)

        // If the array has a different head segment or head segment length after the helper call, then this store needs to bail
        // out
        invalidatedHeadSegment =
            JavascriptArray::Jit_OperationInvalidatedArrayHeadSegment(
                headSegmentBeforeHelperCall,
                headSegmentLengthBeforeHelperCall,
                base)
        test invalidatedHeadSegment, invalidatedHeadSegment
        jz $skipBailOut

        (Bail out with IR::BailOutOnInvalidatedArrayHeadSegment)

        $skipBailOut:
    */

    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy);
    Assert(instr->GetDst());
    Assert(instr->GetDst()->IsIndirOpnd());

    Func *const func = instr->m_func;

    IR::RegOpnd *const baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    Assert(!baseValueType.IsNotArrayOrObjectWithArray());
    const bool isArrayOrObjectWithArray = baseValueType.IsArrayOrObjectWithArray();
    IR::ArrayRegOpnd *const arrayOpnd = baseOpnd->IsArrayRegOpnd() ? baseOpnd->AsArrayRegOpnd() : nullptr;

    IR::RegOpnd *headSegmentBeforeHelperCallOpnd;
    IR::AutoReuseOpnd autoReuseHeadSegmentBeforeHelperCallOpnd;
    if(isArrayOrObjectWithArray && arrayOpnd && arrayOpnd->HeadSegmentSym())
    {
        headSegmentBeforeHelperCallOpnd = IR::RegOpnd::New(arrayOpnd->HeadSegmentSym(), TyMachPtr, func);
        autoReuseHeadSegmentBeforeHelperCallOpnd.Initialize(headSegmentBeforeHelperCallOpnd, func);
    }
    else
    {
        // Record the array head segment before the helper call
        //     headSegmentBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayHeadSegmentForArrayOrObjectWithArray(base)
        m_lowererMD.LoadHelperArgument(instr, baseOpnd);
        IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
        headSegmentBeforeHelperCallOpnd = IR::RegOpnd::New(StackSym::New(TyMachPtr, func), TyMachPtr, func);
        autoReuseHeadSegmentBeforeHelperCallOpnd.Initialize(headSegmentBeforeHelperCallOpnd, func);
        callInstr->SetDst(headSegmentBeforeHelperCallOpnd);
        instr->InsertBefore(callInstr);
        m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_GetArrayHeadSegmentForArrayOrObjectWithArray);
    }

    IR::RegOpnd *headSegmentLengthBeforeHelperCallOpnd;
    IR::AutoReuseOpnd autoReuseHeadSegmentLengthBeforeHelperCallOpnd;
    if(isArrayOrObjectWithArray && arrayOpnd && arrayOpnd->HeadSegmentLengthSym())
    {
        headSegmentLengthBeforeHelperCallOpnd = IR::RegOpnd::New(arrayOpnd->HeadSegmentLengthSym(), TyUint32, func);
        autoReuseHeadSegmentLengthBeforeHelperCallOpnd.Initialize(headSegmentLengthBeforeHelperCallOpnd, func);
    }
    else
    {
        headSegmentLengthBeforeHelperCallOpnd = IR::RegOpnd::New(StackSym::New(TyUint32, func), TyUint32, func);
        autoReuseHeadSegmentLengthBeforeHelperCallOpnd.Initialize(headSegmentLengthBeforeHelperCallOpnd, func);
        if(isArrayOrObjectWithArray && arrayOpnd && arrayOpnd->HeadSegmentSym())
        {
            // Record the array head segment length before the helper call
            //     mov headSegmentLengthBeforeHelperCall, [headSegmentBeforeHelperCall + offsetOf(length)]
            InsertMove(
                headSegmentLengthBeforeHelperCallOpnd,
                IR::IndirOpnd::New(
                    headSegmentBeforeHelperCallOpnd,
                    Js::SparseArraySegmentBase::GetOffsetOfLength(),
                    TyUint32,
                    func),
                instr);
        }
        else
        {
            // Record the array head segment length before the helper call
            //     headSegmentLengthBeforeHelperCall =
            //         Js::JavascriptArray::Jit_GetArrayHeadSegmentLength(headSegmentBeforeHelperCall)
            m_lowererMD.LoadHelperArgument(instr, headSegmentBeforeHelperCallOpnd);
            IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
            callInstr->SetDst(headSegmentLengthBeforeHelperCallOpnd);
            instr->InsertBefore(callInstr);
            m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_GetArrayHeadSegmentLength);
        }
    }

    IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(isInHelperBlock);
    LowerOneBailOutKind(instr, IR::BailOutOnInvalidatedArrayHeadSegment, isInHelperBlock);
    IR::Instr *const insertBeforeInstr = instr->m_next;

    // If the array has a different head segment or head segment length after the helper call, then this store needs to bail out
    //     invalidatedHeadSegment =
    //         JavascriptArray::Jit_OperationInvalidatedArrayHeadSegment(
    //             headSegmentBeforeHelperCall,
    //             headSegmentLengthBeforeHelperCall,
    //             base)
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, baseOpnd);
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, headSegmentLengthBeforeHelperCallOpnd);
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, headSegmentBeforeHelperCallOpnd);
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
    IR::RegOpnd *const invalidatedHeadSegmentOpnd = IR::RegOpnd::New(TyUint8, func);
    const IR::AutoReuseOpnd autoReuseInvalidatedHeadSegmentOpnd(invalidatedHeadSegmentOpnd, func);
    callInstr->SetDst(invalidatedHeadSegmentOpnd);
    insertBeforeInstr->InsertBefore(callInstr);
    m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_OperationInvalidatedArrayHeadSegment);

    //     test invalidatedHeadSegment, invalidatedHeadSegment
    //     jz $skipBailOut
    InsertTestBranch(
        invalidatedHeadSegmentOpnd,
        invalidatedHeadSegmentOpnd,
        Js::OpCode::BrEq_A,
        skipBailOutLabel,
        insertBeforeInstr);

    //     (Bail out with IR::BailOutOnInvalidatedArrayHeadSegment)
    //     $skipBailOut:
}